

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void finish_pass_gather(j_compress_ptr cinfo)

{
  JHUFF_TBL *pJVar1;
  long in_RDI;
  boolean did_ac [4];
  boolean did_dc [4];
  JHUFF_TBL **htblptr;
  jpeg_component_info *compptr;
  int tbl;
  int ci;
  huff_entropy_ptr entropy;
  long *in_stack_00000820;
  JHUFF_TBL *in_stack_00000828;
  j_compress_ptr in_stack_00000830;
  int aiStack_48 [2];
  huff_entropy_ptr in_stack_ffffffffffffffc0;
  int local_38 [4];
  long *local_28;
  long local_20;
  int local_18;
  int local_14;
  undefined8 local_10;
  long local_8;
  
  local_10 = *(undefined8 *)(in_RDI + 0x230);
  local_8 = in_RDI;
  if (*(int *)(in_RDI + 0x158) != 0) {
    emit_eobrun(in_stack_ffffffffffffffc0);
  }
  memset(local_38,0,0x10);
  memset(aiStack_48,0,0x10);
  for (local_14 = 0; local_14 < *(int *)(local_8 + 0x170); local_14 = local_14 + 1) {
    local_20 = *(long *)(local_8 + 0x178 + (long)local_14 * 8);
    if ((*(int *)(local_8 + 0x1cc) == 0) && (*(int *)(local_8 + 0x1d4) == 0)) {
      local_18 = *(int *)(local_20 + 0x14);
      if (local_38[local_18] == 0) {
        local_28 = (long *)(local_8 + 0xa0 + (long)local_18 * 8);
        if (*local_28 == 0) {
          pJVar1 = jpeg_alloc_huff_table((j_common_ptr)in_stack_ffffffffffffffc0);
          *local_28 = (long)pJVar1;
        }
        jpeg_gen_optimal_table(in_stack_00000830,in_stack_00000828,in_stack_00000820);
        local_38[local_18] = 1;
      }
    }
    if (*(int *)(local_8 + 0x1d0) != 0) {
      local_18 = *(int *)(local_20 + 0x18);
      if (aiStack_48[local_18] == 0) {
        local_28 = (long *)(local_8 + 0xc0 + (long)local_18 * 8);
        if (*local_28 == 0) {
          pJVar1 = jpeg_alloc_huff_table((j_common_ptr)in_stack_ffffffffffffffc0);
          *local_28 = (long)pJVar1;
        }
        jpeg_gen_optimal_table(in_stack_00000830,in_stack_00000828,in_stack_00000820);
        aiStack_48[local_18] = 1;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass_gather (j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;
  JHUFF_TBL **htblptr;
  boolean did_dc[NUM_HUFF_TBLS];
  boolean did_ac[NUM_HUFF_TBLS];

  /* It's important not to apply jpeg_gen_optimal_table more than once
   * per table, because it clobbers the input frequency counts!
   */
  if (cinfo->progressive_mode)
    /* Flush out buffered data (all we care about is counting the EOB symbol) */
    emit_eobrun(entropy);

  MEMZERO(did_dc, SIZEOF(did_dc));
  MEMZERO(did_ac, SIZEOF(did_ac));

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (! did_dc[tbl]) {
	htblptr = & cinfo->dc_huff_tbl_ptrs[tbl];
	if (*htblptr == NULL)
	  *htblptr = jpeg_alloc_huff_table((j_common_ptr) cinfo);
	jpeg_gen_optimal_table(cinfo, *htblptr, entropy->dc_count_ptrs[tbl]);
	did_dc[tbl] = TRUE;
      }
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (! did_ac[tbl]) {
	htblptr = & cinfo->ac_huff_tbl_ptrs[tbl];
	if (*htblptr == NULL)
	  *htblptr = jpeg_alloc_huff_table((j_common_ptr) cinfo);
	jpeg_gen_optimal_table(cinfo, *htblptr, entropy->ac_count_ptrs[tbl]);
	did_ac[tbl] = TRUE;
      }
    }
  }
}